

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

short bloaty::ReadFixed<short,2ul>(string_view *data)

{
  short sVar1;
  size_type sVar2;
  short *psVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *unaff_retaddr;
  short val;
  
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (sVar2 < 2) {
    Throw(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  psVar3 = (short *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
  sVar1 = *psVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RDI,2);
  return sVar1;
}

Assistant:

T ReadFixed(std::string_view *data) {
  static_assert(N <= sizeof(T), "N too big for this data type");
  T val = 0;
  if (data->size() < N) {
    THROW("premature EOF reading fixed-length data");
  }
  memcpy(&val, data->data(), N);
  data->remove_prefix(N);
  return val;
}